

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void DoSectorDamage(AActor *actor,sector_t *sec,int amount,FName *type,PClassActor *protectClass,
                   int flags)

{
  AInventory *pAVar1;
  FName local_24;
  DAngle local_20;
  
  if ((((((actor->flags).Value & 4) != 0) &&
       (((flags & 2U) != 0 || (actor->player != (player_t *)0x0)))) &&
      (((flags & 1U) != 0 || (actor->player == (player_t *)0x0)))) &&
     (((((flags & 4U) != 0 ||
        (ABS((actor->__Pos).Z -
             ((actor->__Pos).Y * (sec->floorplane).normal.Y +
             (sec->floorplane).D + (actor->__Pos).X * (sec->floorplane).normal.X) *
             (sec->floorplane).negiC) < 1.52587890625e-05)) || (actor->waterlevel != 0)) &&
      ((protectClass == (PClassActor *)0x0 ||
       (pAVar1 = AActor::FindInventory(actor,protectClass,SUB41((flags & 8U) >> 3,0)),
       pAVar1 == (AInventory *)0x0)))))) {
    local_24 = (FName)type->Index;
    local_20.Degrees = 0.0;
    P_DamageMobj(actor,(AActor *)0x0,(AActor *)0x0,amount,&local_24,0,&local_20);
  }
  return;
}

Assistant:

static void DoSectorDamage(AActor *actor, sector_t *sec, int amount, FName type, PClassActor *protectClass, int flags)
{
	if (!(actor->flags & MF_SHOOTABLE))
		return;

	if (!(flags & DAMAGE_NONPLAYERS) && actor->player == NULL)
		return;

	if (!(flags & DAMAGE_PLAYERS) && actor->player != NULL)
		return;

	if (!(flags & DAMAGE_IN_AIR) && !actor->isAtZ(sec->floorplane.ZatPoint(actor)) && !actor->waterlevel)
		return;

	if (protectClass != NULL)
	{
		if (actor->FindInventory(protectClass, !!(flags & DAMAGE_SUBCLASSES_PROTECT)))
			return;
	}

	P_DamageMobj (actor, NULL, NULL, amount, type);
}